

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O3

void test_bson_iter_overwrite_bool(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  undefined1 *puVar4;
  char *pcVar5;
  ulong uVar6;
  undefined1 *puVar7;
  undefined8 *puVar8;
  bson_t *pbVar9;
  bson_t *pbVar10;
  bson_t *pbVar11;
  TestSuite *suite;
  bson_t *pbVar12;
  undefined1 auVar13 [16];
  bson_iter_t iter;
  bson_t b;
  undefined1 auStack_2018 [4104];
  bson_t *pbStack_1010;
  code *pcStack_1008;
  undefined8 uStack_f90;
  undefined1 uStack_f88;
  TestSuite aTStack_f80 [5];
  code *pcStack_e88;
  int *piStack_e10;
  int iStack_e08;
  undefined1 auStack_e04 [4];
  undefined1 auStack_e00 [232];
  bson_t *pbStack_d18;
  undefined1 *puStack_d10;
  code *pcStack_d08;
  bson_t bStack_d00;
  bson_t abStack_c80 [2];
  undefined8 uStack_b48;
  char *pcStack_b40;
  bson_t *pbStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  bson_t *pbStack_b20;
  char *pcStack_b18;
  code *pcStack_b08;
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [232];
  undefined1 *puStack_998;
  undefined1 *puStack_990;
  code *pcStack_988;
  undefined1 auStack_980 [128];
  undefined1 auStack_900 [368];
  undefined1 *puStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [128];
  undefined1 auStack_700 [128];
  undefined1 auStack_680 [128];
  undefined1 auStack_600 [368];
  undefined8 *puStack_490;
  code *apcStack_488 [13];
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined1 auStack_410 [16];
  undefined8 auStack_400 [14];
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 auStack_380 [360];
  undefined1 *puStack_218;
  code *pcStack_208;
  undefined1 auStack_200 [128];
  undefined1 local_180 [368];
  
  puVar7 = local_180;
  pcStack_208 = (code *)0x12b41f;
  bson_init(puVar7);
  pcStack_208 = (code *)0x12b438;
  cVar1 = bson_append_bool(puVar7,"key",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_208 = (code *)0x12b4be;
    test_bson_iter_overwrite_bool_cold_1();
LAB_0012b4be:
    pcStack_208 = (code *)0x12b4c3;
    test_bson_iter_overwrite_bool_cold_2();
LAB_0012b4c3:
    pcStack_208 = (code *)0x12b4c8;
    test_bson_iter_overwrite_bool_cold_3();
LAB_0012b4c8:
    pcStack_208 = (code *)0x12b4cd;
    test_bson_iter_overwrite_bool_cold_4();
LAB_0012b4cd:
    pcStack_208 = (code *)0x12b4d2;
    test_bson_iter_overwrite_bool_cold_5();
  }
  else {
    pcStack_208 = (code *)0x12b453;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    if (cVar1 == '\0') goto LAB_0012b4be;
    pcStack_208 = (code *)0x12b45f;
    iVar2 = bson_iter_type(auStack_200);
    if (iVar2 != 8) goto LAB_0012b4c3;
    pcStack_208 = (code *)0x12b471;
    bson_iter_overwrite_bool(auStack_200,0);
    pcStack_208 = (code *)0x12b488;
    cVar1 = bson_iter_init_find(auStack_200,local_180,"key");
    puVar7 = auStack_200;
    if (cVar1 == '\0') goto LAB_0012b4c8;
    pcStack_208 = (code *)0x12b494;
    iVar2 = bson_iter_type(auStack_200);
    puVar7 = auStack_200;
    if (iVar2 != 8) goto LAB_0012b4cd;
    pcStack_208 = (code *)0x12b4a1;
    cVar1 = bson_iter_bool(auStack_200);
    puVar7 = auStack_200;
    if (cVar1 == '\0') {
      pcStack_208 = (code *)0x12b4b2;
      bson_destroy(local_180);
      return;
    }
  }
  pcStack_208 = test_bson_iter_overwrite_decimal128;
  test_bson_iter_overwrite_bool_cold_6();
  puVar8 = &uStack_390;
  uStack_388 = 0;
  uStack_390 = 1;
  uStack_418 = 0;
  uStack_420 = 2;
  puVar4 = auStack_380;
  apcStack_488[0] = (code *)0x12b51c;
  puStack_218 = puVar7;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  bson_init(puVar4);
  apcStack_488[0] = (code *)0x12b533;
  cVar1 = bson_append_decimal128(puVar4,"key",0xffffffff,puVar8);
  if (cVar1 == '\0') {
    apcStack_488[0] = (code *)0x12b603;
    test_bson_iter_overwrite_decimal128_cold_1();
LAB_0012b603:
    apcStack_488[0] = (code *)0x12b608;
    test_bson_iter_overwrite_decimal128_cold_2();
LAB_0012b608:
    apcStack_488[0] = (code *)0x12b60d;
    test_bson_iter_overwrite_decimal128_cold_3();
LAB_0012b60d:
    apcStack_488[0] = (code *)0x12b612;
    test_bson_iter_overwrite_decimal128_cold_4();
LAB_0012b612:
    apcStack_488[0] = (code *)0x12b617;
    test_bson_iter_overwrite_decimal128_cold_5();
LAB_0012b617:
    apcStack_488[0] = (code *)0x12b61c;
    test_bson_iter_overwrite_decimal128_cold_6();
  }
  else {
    apcStack_488[0] = (code *)0x12b557;
    cVar1 = bson_iter_init_find(auStack_400,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b603;
    apcStack_488[0] = (code *)0x12b56c;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x13) goto LAB_0012b608;
    puVar8 = auStack_400;
    apcStack_488[0] = (code *)0x12b58a;
    bson_iter_overwrite_decimal128(puVar8,&uStack_420);
    apcStack_488[0] = (code *)0x12b5a1;
    cVar1 = bson_iter_init_find(puVar8,auStack_380,"key");
    if (cVar1 == '\0') goto LAB_0012b60d;
    apcStack_488[0] = (code *)0x12b5b2;
    iVar2 = bson_iter_type(auStack_400);
    if (iVar2 != 0x13) goto LAB_0012b612;
    apcStack_488[0] = (code *)0x12b5c9;
    cVar1 = bson_iter_decimal128(auStack_400,auStack_410);
    if (cVar1 == '\0') goto LAB_0012b617;
    auVar13[0] = -((char)uStack_420 == auStack_410[0]);
    auVar13[1] = -(uStack_420._1_1_ == auStack_410[1]);
    auVar13[2] = -(uStack_420._2_1_ == auStack_410[2]);
    auVar13[3] = -(uStack_420._3_1_ == auStack_410[3]);
    auVar13[4] = -(uStack_420._4_1_ == auStack_410[4]);
    auVar13[5] = -(uStack_420._5_1_ == auStack_410[5]);
    auVar13[6] = -(uStack_420._6_1_ == auStack_410[6]);
    auVar13[7] = -(uStack_420._7_1_ == auStack_410[7]);
    auVar13[8] = -((char)uStack_418 == auStack_410[8]);
    auVar13[9] = -(uStack_418._1_1_ == auStack_410[9]);
    auVar13[10] = -(uStack_418._2_1_ == auStack_410[10]);
    auVar13[0xb] = -(uStack_418._3_1_ == auStack_410[0xb]);
    auVar13[0xc] = -(uStack_418._4_1_ == auStack_410[0xc]);
    auVar13[0xd] = -(uStack_418._5_1_ == auStack_410[0xd]);
    auVar13[0xe] = -(uStack_418._6_1_ == auStack_410[0xe]);
    auVar13[0xf] = -(uStack_418._7_1_ == auStack_410[0xf]);
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf
                ) == 0xffff) {
      apcStack_488[0] = (code *)0x12b5f5;
      bson_destroy(auStack_380);
      return;
    }
  }
  apcStack_488[0] = test_bson_iter_recurse;
  test_bson_iter_overwrite_decimal128_cold_7();
  pcStack_788 = (code *)0x12b63e;
  puStack_490 = puVar8;
  apcStack_488[0] = (code *)&pcStack_208;
  bson_init(auStack_600);
  pcStack_788 = (code *)0x12b64e;
  bson_init(auStack_700);
  pcStack_788 = (code *)0x12b664;
  cVar1 = bson_append_int32(auStack_700,"0",1,0);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x12b79e;
    test_bson_iter_recurse_cold_1();
LAB_0012b79e:
    pcStack_788 = (code *)0x12b7a3;
    test_bson_iter_recurse_cold_2();
LAB_0012b7a3:
    pcStack_788 = (code *)0x12b7a8;
    test_bson_iter_recurse_cold_3();
LAB_0012b7a8:
    pcStack_788 = (code *)0x12b7ad;
    test_bson_iter_recurse_cold_4();
LAB_0012b7ad:
    pcStack_788 = (code *)0x12b7b2;
    test_bson_iter_recurse_cold_5();
LAB_0012b7b2:
    pcStack_788 = (code *)0x12b7b7;
    test_bson_iter_recurse_cold_6();
LAB_0012b7b7:
    pcStack_788 = (code *)0x12b7bc;
    test_bson_iter_recurse_cold_7();
LAB_0012b7bc:
    pcStack_788 = (code *)0x12b7c1;
    test_bson_iter_recurse_cold_8();
LAB_0012b7c1:
    pcStack_788 = (code *)0x12b7c6;
    test_bson_iter_recurse_cold_9();
LAB_0012b7c6:
    pcStack_788 = (code *)0x12b7cb;
    test_bson_iter_recurse_cold_10();
  }
  else {
    pcStack_788 = (code *)0x12b68a;
    cVar1 = bson_append_int32(auStack_700,"1",1,1);
    if (cVar1 == '\0') goto LAB_0012b79e;
    pcStack_788 = (code *)0x12b6b0;
    cVar1 = bson_append_int32(auStack_700,"2",1,2);
    if (cVar1 == '\0') goto LAB_0012b7a3;
    pcStack_788 = (code *)0x12b6d9;
    cVar1 = bson_append_array(auStack_600,"key",0xffffffff,auStack_700);
    if (cVar1 == '\0') goto LAB_0012b7a8;
    pcStack_788 = (code *)0x12b6fd;
    cVar1 = bson_iter_init_find(auStack_680,auStack_600,"key");
    if (cVar1 == '\0') goto LAB_0012b7ad;
    pcStack_788 = (code *)0x12b712;
    iVar2 = bson_iter_type(auStack_680);
    if (iVar2 != 4) goto LAB_0012b7b2;
    pcStack_788 = (code *)0x12b72b;
    cVar1 = bson_iter_recurse(auStack_680,auStack_780);
    if (cVar1 == '\0') goto LAB_0012b7b7;
    pcStack_788 = (code *)0x12b742;
    cVar1 = bson_iter_find(auStack_780,"0");
    if (cVar1 == '\0') goto LAB_0012b7bc;
    pcStack_788 = (code *)0x12b755;
    cVar1 = bson_iter_find(auStack_780,"1");
    if (cVar1 == '\0') goto LAB_0012b7c1;
    pcStack_788 = (code *)0x12b768;
    cVar1 = bson_iter_find(auStack_780,"2");
    if (cVar1 == '\0') goto LAB_0012b7c6;
    pcStack_788 = (code *)0x12b774;
    cVar1 = bson_iter_next(auStack_780);
    if (cVar1 == '\0') {
      pcStack_788 = (code *)0x12b785;
      bson_destroy(auStack_600);
      pcStack_788 = (code *)0x12b792;
      bson_destroy(auStack_700);
      return;
    }
  }
  pcStack_788 = test_bson_iter_init_find_case;
  test_bson_iter_recurse_cold_11();
  pcStack_988 = (code *)0x12b7f0;
  puStack_790 = auStack_700;
  pcStack_788 = (code *)apcStack_488;
  bson_init(auStack_900);
  pcStack_988 = (code *)0x12b809;
  cVar1 = bson_append_int32(auStack_900,"FOO",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_988 = (code *)0x12b850;
    test_bson_iter_init_find_case_cold_1();
LAB_0012b850:
    pcStack_988 = (code *)0x12b855;
    test_bson_iter_init_find_case_cold_2();
  }
  else {
    pcStack_988 = (code *)0x12b824;
    cVar1 = bson_iter_init_find_case(auStack_980,auStack_900,"foo");
    if (cVar1 == '\0') goto LAB_0012b850;
    pcStack_988 = (code *)0x12b830;
    iVar2 = bson_iter_int32(auStack_980);
    if (iVar2 == 0x4d2) {
      pcStack_988 = (code *)0x12b844;
      bson_destroy(auStack_900);
      return;
    }
  }
  pcStack_988 = test_bson_iter_find_descendant;
  test_bson_iter_init_find_case_cold_3();
  pcStack_b08 = (code *)0x12b878;
  puStack_998 = auStack_900;
  puStack_990 = puVar4;
  pcStack_988 = (code *)&pcStack_788;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/dotkey.bson"
                   );
  pcStack_b08 = (code *)0x12b88b;
  cVar1 = bson_iter_init(auStack_a80,pbVar3);
  if (cVar1 == '\0') {
    pcStack_b08 = (code *)0x12bab0;
    test_bson_iter_find_descendant_cold_1();
LAB_0012bab0:
    pcStack_b08 = (code *)0x12bab5;
    test_bson_iter_find_descendant_cold_2();
LAB_0012bab5:
    pcStack_b08 = (code *)0x12baba;
    test_bson_iter_find_descendant_cold_3();
LAB_0012baba:
    pcStack_b08 = (code *)0x12babf;
    test_bson_iter_find_descendant_cold_4();
LAB_0012babf:
    pcStack_b08 = (code *)0x12bac4;
    test_bson_iter_find_descendant_cold_5();
LAB_0012bac4:
    pcStack_b08 = (code *)0x12bac9;
    test_bson_iter_find_descendant_cold_6();
LAB_0012bac9:
    pcStack_b08 = (code *)0x12bace;
    test_bson_iter_find_descendant_cold_7();
LAB_0012bace:
    pcStack_b08 = (code *)0x12bad3;
    test_bson_iter_find_descendant_cold_8();
LAB_0012bad3:
    pcStack_b08 = (code *)0x12bad8;
    test_bson_iter_find_descendant_cold_9();
LAB_0012bad8:
    pcStack_b08 = (code *)0x12badd;
    test_bson_iter_find_descendant_cold_10();
LAB_0012badd:
    pcStack_b08 = (code *)0x12bae2;
    test_bson_iter_find_descendant_cold_11();
LAB_0012bae2:
    pcStack_b08 = (code *)0x12bae7;
    test_bson_iter_find_descendant_cold_12();
LAB_0012bae7:
    pcStack_b08 = (code *)0x12baec;
    test_bson_iter_find_descendant_cold_13();
  }
  else {
    pcStack_b08 = (code *)0x12b8aa;
    cVar1 = bson_iter_find_descendant(auStack_a80,"a.b.c.0",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bab0;
    pcStack_b08 = (code *)0x12b8ba;
    iVar2 = bson_iter_type(auStack_b00);
    if (iVar2 != 0x10) goto LAB_0012bab5;
    pcStack_b08 = (code *)0x12b8cb;
    iVar2 = bson_iter_int32(auStack_b00);
    if (iVar2 != 1) goto LAB_0012baba;
    pcStack_b08 = (code *)0x12b8dc;
    bson_destroy(pbVar3);
    pcStack_b08 = (code *)0x12b8e1;
    pbVar3 = (bson_t *)bson_bcon_magic();
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = "]";
    pbStack_b20 = (bson_t *)0x14ad57;
    uStack_b28 = 1;
    uStack_b30 = 0xf;
    pcStack_b40 = "baz";
    uStack_b48 = 0x12b930;
    pbStack_b38 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"foo","{","bar","[","{");
    pcStack_b08 = (code *)0x12b947;
    cVar1 = bson_iter_init(auStack_a80,puVar4);
    if (cVar1 == '\0') goto LAB_0012babf;
    pcStack_b08 = (code *)0x12b966;
    cVar1 = bson_iter_find_descendant(auStack_a80,"foo.bar.0.baz",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bac4;
    pcStack_b08 = (code *)0x12b976;
    iVar2 = bson_iter_type(auStack_b00);
    if (iVar2 != 0x10) goto LAB_0012bac9;
    pcStack_b08 = (code *)0x12b987;
    iVar2 = bson_iter_int32(auStack_b00);
    if (iVar2 != 1) goto LAB_0012bace;
    pcStack_b08 = (code *)0x12b998;
    bson_destroy(puVar4);
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = (char *)0xf;
    uStack_b28 = 0x12b9c4;
    pbStack_b20 = pbVar3;
    puVar4 = (undefined1 *)bcon_new(0,"nModified",pbVar3,0xf,1,"n");
    pcStack_b08 = (code *)0x12b9db;
    cVar1 = bson_iter_init(auStack_a80,puVar4);
    if (cVar1 == '\0') goto LAB_0012bad3;
    pcStack_b08 = (code *)0x12b9fa;
    cVar1 = bson_iter_find_descendant(auStack_a80,"n",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bad8;
    pcStack_b08 = (code *)0x12ba0a;
    pcVar5 = (char *)bson_iter_key(auStack_b00);
    if ((*pcVar5 != 'n') || (pcVar5[1] != '\0')) goto LAB_0012badd;
    pcStack_b08 = (code *)0x12ba25;
    bson_destroy(puVar4);
    pcStack_b08 = (code *)0x0;
    pcStack_b18 = (char *)0xf;
    uStack_b28 = 0x12ba51;
    pbStack_b20 = pbVar3;
    pbVar3 = (bson_t *)bcon_new(0,"",pbVar3,0xf,1,"n");
    pcStack_b08 = (code *)0x12ba68;
    cVar1 = bson_iter_init(auStack_a80,pbVar3);
    if (cVar1 == '\0') goto LAB_0012bae2;
    pcStack_b08 = (code *)0x12ba83;
    cVar1 = bson_iter_find_descendant(auStack_a80,"n",auStack_b00);
    if (cVar1 == '\0') goto LAB_0012bae7;
    pcStack_b08 = (code *)0x12ba8f;
    pcVar5 = (char *)bson_iter_key(auStack_b00);
    if ((*pcVar5 == 'n') && (pcVar5[1] == '\0')) {
      pcStack_b08 = (code *)0x12baa2;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_b08 = test_bson_iter_as_bool;
  test_bson_iter_find_descendant_cold_14();
  pbVar10 = &bStack_d00;
  pbVar11 = &bStack_d00;
  pbVar12 = &bStack_d00;
  pbVar9 = abStack_c80;
  pcStack_d08 = (code *)0x12bb15;
  pbStack_b20 = pbVar3;
  pcStack_b18 = puVar4;
  pcStack_b08 = (code *)&pcStack_988;
  bson_init(pbVar9);
  pcStack_d08 = (code *)0x12bb2e;
  bson_append_int32(pbVar9,"int32[true]",0xffffffff,1);
  pcStack_d08 = (code *)0x12bb44;
  bson_append_int32(pbVar9,"int32[false]",0xffffffff,0);
  pcStack_d08 = (code *)0x12bb60;
  bson_append_int64(pbVar9,"int64[true]",0xffffffff,1);
  pcStack_d08 = (code *)0x12bb79;
  bson_append_int64(pbVar9,"int64[false]",0xffffffff,0);
  pcStack_d08 = (code *)0x12bb91;
  bson_append_double(0x3ff0000000000000,pbVar9,"int64[true]",0xffffffff);
  pcStack_d08 = (code *)0x12bba4;
  bson_append_double(pbVar9,"int64[false]",0xffffffff);
  pcStack_d08 = (code *)0x12bbb2;
  bson_iter_init(&bStack_d00,pbVar9);
  pcStack_d08 = (code *)0x12bbba;
  bson_iter_next(&bStack_d00);
  pcStack_d08 = (code *)0x12bbc2;
  cVar1 = bson_iter_as_bool(&bStack_d00);
  if (cVar1 == '\0') {
    pcStack_d08 = (code *)0x12bc5a;
    test_bson_iter_as_bool_cold_1();
LAB_0012bc5a:
    pcStack_d08 = (code *)0x12bc5f;
    test_bson_iter_as_bool_cold_6();
LAB_0012bc5f:
    pbVar10 = pbVar9;
    pcStack_d08 = (code *)0x12bc64;
    test_bson_iter_as_bool_cold_2();
LAB_0012bc64:
    pcStack_d08 = (code *)0x12bc69;
    test_bson_iter_as_bool_cold_5();
LAB_0012bc69:
    pbVar11 = pbVar10;
    pcStack_d08 = (code *)0x12bc6e;
    test_bson_iter_as_bool_cold_3();
  }
  else {
    pcStack_d08 = (code *)0x12bbd5;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bbdd;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar9 = &bStack_d00;
    if (cVar1 != '\0') goto LAB_0012bc5a;
    pcStack_d08 = (code *)0x12bbec;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bbf4;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar9 = &bStack_d00;
    if (cVar1 == '\0') goto LAB_0012bc5f;
    pcStack_d08 = (code *)0x12bc03;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bc0b;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    if (cVar1 != '\0') goto LAB_0012bc64;
    pcStack_d08 = (code *)0x12bc1a;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bc22;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    pbVar10 = &bStack_d00;
    if (cVar1 == '\0') goto LAB_0012bc69;
    pcStack_d08 = (code *)0x12bc31;
    bson_iter_next(&bStack_d00);
    pcStack_d08 = (code *)0x12bc39;
    cVar1 = bson_iter_as_bool(&bStack_d00);
    if (cVar1 == '\0') {
      pcStack_d08 = (code *)0x12bc4a;
      bson_destroy(abStack_c80);
      return;
    }
  }
  pcStack_d08 = test_bson_iter_binary_deprecated;
  test_bson_iter_as_bool_cold_4();
  pcStack_e88 = (code *)0x12bc91;
  pbStack_d18 = pbVar11;
  puStack_d10 = (undefined1 *)&bStack_d00;
  pcStack_d08 = (code *)&pcStack_b08;
  pbVar3 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar3 == (bson_t *)0x0) {
    pcStack_e88 = (code *)0x12bd06;
    test_bson_iter_binary_deprecated_cold_5();
LAB_0012bd06:
    pcStack_e88 = (code *)0x12bd0b;
    test_bson_iter_binary_deprecated_cold_1();
LAB_0012bd0b:
    pcStack_e88 = (code *)0x12bd10;
    test_bson_iter_binary_deprecated_cold_2();
LAB_0012bd10:
    pcStack_e88 = (code *)0x12bd15;
    test_bson_iter_binary_deprecated_cold_3();
  }
  else {
    pcStack_e88 = (code *)0x12bca9;
    cVar1 = bson_iter_init(auStack_e00,pbVar3);
    pbVar11 = pbVar3;
    if (cVar1 == '\0') goto LAB_0012bd06;
    pcStack_e88 = (code *)0x12bcba;
    cVar1 = bson_iter_next(auStack_e00);
    if (cVar1 == '\0') goto LAB_0012bd0b;
    pbVar12 = (bson_t *)&iStack_e08;
    pcStack_e88 = (code *)0x12bcdd;
    bson_iter_binary(auStack_e00,auStack_e04,pbVar12,&piStack_e10);
    if (iStack_e08 != 4) goto LAB_0012bd10;
    if (*piStack_e10 == 0x34333231) {
      pcStack_e88 = (code *)0x12bcf8;
      bson_destroy(pbVar3);
      return;
    }
  }
  pcStack_e88 = test_bson_iter_from_data;
  test_bson_iter_binary_deprecated_cold_4();
  uStack_f90 = 0x100620800000009;
  uStack_f88 = 0;
  suite = aTStack_f80;
  pcStack_1008 = (code *)0x12bd51;
  pcStack_e88 = (code *)&pcStack_d08;
  cVar1 = bson_iter_init_from_data(suite,&uStack_f90,9);
  if (cVar1 == '\0') {
    pcStack_1008 = (code *)0x12bd93;
    test_bson_iter_from_data_cold_1();
LAB_0012bd93:
    pcStack_1008 = (code *)0x12bd98;
    test_bson_iter_from_data_cold_2();
LAB_0012bd98:
    pcStack_1008 = (code *)0x12bd9d;
    test_bson_iter_from_data_cold_3();
  }
  else {
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12bd62;
    cVar1 = bson_iter_next();
    if (cVar1 == '\0') goto LAB_0012bd93;
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12bd73;
    iVar2 = bson_iter_type();
    if (iVar2 != 8) goto LAB_0012bd98;
    suite = aTStack_f80;
    pcStack_1008 = (code *)0x12bd85;
    cVar1 = bson_iter_bool();
    if (cVar1 != '\0') {
      return;
    }
  }
  pcStack_1008 = get_bson;
  test_bson_iter_from_data_cold_4();
  pbStack_1010 = pbVar11;
  pcStack_1008 = (code *)pbVar12;
  iVar2 = open((char *)suite,0);
  if (iVar2 != -1) {
    uVar6 = read(iVar2,auStack_2018,0x1000);
    if ((long)uVar6 < 0) goto LAB_0012be04;
    if (uVar6 != 0) {
      bson_new_from_data(auStack_2018,uVar6 & 0xffffffff);
      close(iVar2);
      return;
    }
    get_bson_cold_1();
  }
  get_bson_cold_3();
LAB_0012be04:
  get_bson_cold_2();
  TestSuite_Add(suite,"/bson/as_json/x1000",test_bson_as_json_x1000);
  TestSuite_Add(suite,"/bson/as_json/multi",test_bson_as_json_multi);
  TestSuite_Add(suite,"/bson/as_json/string",test_bson_as_json_string);
  TestSuite_Add(suite,"/bson/as_json/int32",test_bson_as_json_int32);
  TestSuite_Add(suite,"/bson/as_json/int64",test_bson_as_json_int64);
  TestSuite_Add(suite,"/bson/as_json/double",test_bson_as_json_double);
  TestSuite_Add(suite,"/bson/as_json/double/nonfinite",test_bson_as_json_double_nonfinite);
  TestSuite_Add(suite,"/bson/as_json/code",test_bson_as_json_code);
  TestSuite_Add(suite,"/bson/as_json/date_time",test_bson_as_json_date_time);
  TestSuite_Add(suite,"/bson/as_json/regex",test_bson_as_json_regex);
  TestSuite_Add(suite,"/bson/as_json/symbol",test_bson_as_json_symbol);
  TestSuite_Add(suite,"/bson/as_json/utf8",test_bson_as_json_utf8);
  TestSuite_Add(suite,"/bson/as_json/dbpointer",test_bson_as_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_canonical_extended_json/dbpointer",
                test_bson_as_canonical_extended_json_dbpointer);
  TestSuite_Add(suite,"/bson/as_json/stack_overflow",test_bson_as_json_stack_overflow);
  TestSuite_Add(suite,"/bson/as_json/corrupt",test_bson_corrupt);
  TestSuite_Add(suite,"/bson/as_json/corrupt_utf8",test_bson_corrupt_utf8);
  TestSuite_Add(suite,"/bson/as_json/corrupt_binary",test_bson_corrupt_binary);
  TestSuite_Add(suite,"/bson/as_json_spacing",test_bson_as_json_spacing);
  TestSuite_Add(suite,"/bson/array_as_json",test_bson_array_as_json);
  TestSuite_Add(suite,"/bson/json/allow_multiple",test_bson_json_allow_multiple);
  TestSuite_Add(suite,"/bson/json/read/buffering",test_bson_json_read_buffering);
  TestSuite_Add(suite,"/bson/json/read",test_bson_json_read);
  TestSuite_Add(suite,"/bson/json/inc",test_bson_json_inc);
  TestSuite_Add(suite,"/bson/json/array",test_bson_json_array);
  TestSuite_Add(suite,"/bson/json/array/single",test_bson_json_array_single);
  TestSuite_Add(suite,"/bson/json/array/int64",test_bson_json_array_int64);
  TestSuite_Add(suite,"/bson/json/array/subdoc",test_bson_json_array_subdoc);
  TestSuite_Add(suite,"/bson/json/date",test_bson_json_date);
  TestSuite_Add(suite,"/bson/json/date/legacy",test_bson_json_date_legacy);
  TestSuite_Add(suite,"/bson/json/date/long",test_bson_json_date_numberlong);
  TestSuite_Add(suite,"/bson/json/timestamp",test_bson_json_timestamp);
  TestSuite_Add(suite,"/bson/json/read/empty",test_bson_json_read_empty);
  TestSuite_Add(suite,"/bson/json/read/missing_complex",test_bson_json_read_missing_complex);
  TestSuite_Add(suite,"/bson/json/read/invalid_binary",test_bson_json_read_invalid_binary);
  TestSuite_Add(suite,"/bson/json/read/invalid_json",test_bson_json_read_invalid_json);
  TestSuite_Add(suite,"/bson/json/read/bad_cb",test_bson_json_read_bad_cb);
  TestSuite_Add(suite,"/bson/json/read/invalid",test_bson_json_read_invalid);
  TestSuite_Add(suite,"/bson/json/read/raw_utf8",test_bson_json_read_raw_utf8);
  TestSuite_Add(suite,"/bson/json/read/corrupt_utf8",test_bson_json_read_corrupt_utf8);
  TestSuite_Add(suite,"/bson/json/read/decimal128",test_bson_json_read_decimal128);
  TestSuite_Add(suite,"/bson/json/read/dbpointer",test_bson_json_read_dbpointer);
  TestSuite_Add(suite,"/bson/json/read/legacy_regex",test_bson_json_read_legacy_regex);
  TestSuite_Add(suite,"/bson/json/read/regex_options_order",test_bson_json_read_regex_options_order)
  ;
  TestSuite_Add(suite,"/bson/json/read/binary",test_bson_json_read_binary);
  TestSuite_Add(suite,"/bson/json/read/legacy_binary",test_bson_json_read_legacy_binary);
  TestSuite_Add(suite,"/bson/json/read/file",test_json_reader_new_from_file);
  TestSuite_Add(suite,"/bson/json/read/bad_path",test_json_reader_new_from_bad_path);
  TestSuite_Add(suite,"/bson/json/read/$numberLong",test_bson_json_number_long);
  TestSuite_Add(suite,"/bson/json/read/$numberLong/zero",test_bson_json_number_long_zero);
  TestSuite_Add(suite,"/bson/json/read/code",test_bson_json_code);
  TestSuite_Add(suite,"/bson/json/read/code/errors",test_bson_json_code_errors);
  TestSuite_Add(suite,"/bson/json/read/dbref",test_bson_json_dbref);
  TestSuite_Add(suite,"/bson/json/read/uescape",test_bson_json_uescape);
  TestSuite_Add(suite,"/bson/json/read/uescape/key",test_bson_json_uescape_key);
  TestSuite_Add(suite,"/bson/json/read/uescape/bad",test_bson_json_uescape_bad);
  TestSuite_Add(suite,"/bson/json/read/int32",test_bson_json_int32);
  TestSuite_Add(suite,"/bson/json/read/int64",test_bson_json_int64);
  TestSuite_Add(suite,"/bson/json/read/double",test_bson_json_double);
  TestSuite_Add(suite,"/bson/json/read/double/overflow",test_bson_json_double_overflow);
  TestSuite_Add(suite,"/bson/json/read/double/nan",test_bson_json_nan);
  TestSuite_Add(suite,"/bson/json/read/double/infinity",test_bson_json_infinity);
  TestSuite_Add(suite,"/bson/json/read/null",test_bson_json_null);
  TestSuite_Add(suite,"/bson/json/read/empty_final",test_bson_json_empty_final_object);
  TestSuite_Add(suite,"/bson/as_json/decimal128",test_bson_as_json_decimal128);
  TestSuite_Add(suite,"/bson/json/read/$numberDecimal",test_bson_json_number_decimal);
  TestSuite_Add(suite,"/bson/json/errors",test_bson_json_errors);
  TestSuite_Add(suite,"/bson/integer/width",test_bson_integer_width);
  TestSuite_Add(suite,"/bson/json/read/null_in_str",test_bson_json_null_in_str);
  TestSuite_Add(suite,"/bson/as_json/multi_object",test_bson_as_json_multi_object);
  return;
}

Assistant:

static void
test_bson_iter_overwrite_bool (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_bool (&b, "key", -1, true));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   bson_iter_overwrite_bool (&iter, false);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_BOOL (&iter));
   BSON_ASSERT_CMPINT (bson_iter_bool (&iter), ==, false);
   bson_destroy (&b);
}